

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool op_smlad(DisasContext_conflict1 *s,arg_rrrr *a,_Bool m_swap,_Bool sub)

{
  int iVar1;
  ulong uVar2;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar3;
  TCGTemp *pTVar4;
  TCGv_i32 var;
  uintptr_t o_1;
  TCGv_i32 pTVar5;
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o_3;
  uintptr_t o;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  uVar2 = s->features;
  if ((uVar2 & 8) != 0) {
    s_00 = s->uc->tcg_ctx;
    iVar1 = a->rn;
    pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar4 - (long)s_00);
    load_reg_var(s,var,iVar1);
    iVar1 = a->rm;
    pTVar3 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I32,false);
    pTVar5 = (TCGv_i32)((long)pTVar4 - (long)pTVar3);
    load_reg_var(s,pTVar5,iVar1);
    if (m_swap) {
      tcg_gen_rotri_i32_aarch64(s_00,pTVar5,pTVar5,0x10);
    }
    gen_smul_dual(s_00,var,pTVar5);
    if (sub) {
      tcg_gen_sub_i32(s_00,var,var,pTVar5);
    }
    else {
      local_48 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
      local_40 = (TCGTemp *)((long)s_00 + (long)var);
      local_38 = (TCGTemp *)((long)s_00 + (long)pTVar5);
      tcg_gen_callN_aarch64(s_00,helper_add_setq_aarch64,local_40,3,&local_48);
    }
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar5 + (long)s_00));
    iVar1 = a->ra;
    if (iVar1 != 0xf) {
      pTVar3 = s->uc->tcg_ctx;
      pTVar4 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I32,false);
      pTVar5 = (TCGv_i32)((long)pTVar4 - (long)pTVar3);
      load_reg_var(s,pTVar5,iVar1);
      local_48 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
      local_40 = (TCGTemp *)((long)s_00 + (long)var);
      pTVar4 = (TCGTemp *)(pTVar5 + (long)s_00);
      local_38 = pTVar4;
      tcg_gen_callN_aarch64(s_00,helper_add_setq_aarch64,local_40,3,&local_48);
      tcg_temp_free_internal_aarch64(s_00,pTVar4);
    }
    store_reg(s,a->rd,var);
  }
  return SUB41(((uint)uVar2 & 8) >> 3,0);
}

Assistant:

static bool op_smlad(DisasContext *s, arg_rrrr *a, bool m_swap, bool sub)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    if (!ENABLE_ARCH_6) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    if (m_swap) {
        gen_swap_half(tcg_ctx, t2);
    }
    gen_smul_dual(tcg_ctx, t1, t2);

    if (sub) {
        /* This subtraction cannot overflow. */
        tcg_gen_sub_i32(tcg_ctx, t1, t1, t2);
    } else {
        /*
         * This addition cannot overflow 32 bits; however it may
         * overflow considered as a signed operation, in which case
         * we must set the Q flag.
         */
        gen_helper_add_setq(tcg_ctx, t1, tcg_ctx->cpu_env, t1, t2);
    }
    tcg_temp_free_i32(tcg_ctx, t2);

    if (a->ra != 15) {
        t2 = load_reg(s, a->ra);
        gen_helper_add_setq(tcg_ctx, t1, tcg_ctx->cpu_env, t1, t2);
        tcg_temp_free_i32(tcg_ctx, t2);
    }
    store_reg(s, a->rd, t1);
    return true;
}